

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_typed_tests.hpp
# Opt level: O1

TestCase *
iutest::detail::
TypeParamTestInstance<iu_StringViewSplit_x_iutest_x_chain_back_by_stl_str_Test,_iutest::detail::VariadicTypeList<char,_wchar_t,_char16_t,_char32_t>_>
::EachTest<iutest::detail::VariadicTypeList<wchar_t,_char16_t,_char32_t>,_void>::AddTestCase
          (char *testcase,size_t index)

{
  UnitTest *this;
  TestCase *pTVar1;
  size_t in_RCX;
  string local_40;
  
  this = UnitTest::instance();
  MakeIndexTestName_abi_cxx11_(&local_40,(detail *)testcase,(char *)index,in_RCX);
  pTVar1 = UnitTestImpl::AddTestCase<iutest::TypedTestCase<wchar_t>>
                     (&this->super_UnitTestImpl,local_40._M_dataplus._M_p,
                      &internal::helper::TestTypeIdHelper<iutest::detail::None>::_dummy,
                      Test::SetUpTestCase,Test::TearDownTestCase);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return pTVar1;
}

Assistant:

static TestCase* AddTestCase(const char* testcase, size_t index)
        {
#if !defined(IUTEST_NO_EXPLICIT_FUNCTION_TEMPLATE_ARGUMENTS)
            return UnitTest::instance().AddTestCase<_MyTestCase>(
#else
            return UnitTest::instance().AddTestCase(
#endif
#if IUTEST_HAS_TYPED_TEST_APPEND_TYPENAME
                detail::MakeIndexTypedTestName<TypeParam>(testcase, index).c_str()
#else
                detail::MakeIndexTestName(testcase, index).c_str()
#endif
                , internal::GetTypeId<detail::None>()   // TypeId を統一するためダミー引数を渡す
                , TestBody::SetUpTestCase
                , TestBody::TearDownTestCase
#if defined(IUTEST_NO_EXPLICIT_FUNCTION_TEMPLATE_ARGUMENTS)
                , detail::explicit_type<_MyTestCase>()
#endif
                );
        }